

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O1

rotation_t *
opengv::relative_pose::ge
          (rotation_t *__return_storage_ptr__,RelativeAdapterBase *adapter,
          vector<int,_std::allocator<int>_> *indices,bool useWeights)

{
  geOutput_t output;
  Indices local_1d8;
  geOutput_t local_1c0;
  
  local_1d8._useIndices = true;
  local_1d8._numberCorrespondences =
       (long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start >> 2;
  local_1d8._indices = indices;
  ge(__return_storage_ptr__,adapter,&local_1d8,&local_1c0,useWeights);
  return __return_storage_ptr__;
}

Assistant:

opengv::rotation_t
opengv::relative_pose::ge(
    const RelativeAdapterBase & adapter,
    const std::vector<int> & indices,
    bool useWeights )
{
  geOutput_t output;
  //output.rotation = adapter.getR12(); //finding starting value using arun
  return ge(adapter,indices,output,useWeights);
}